

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

bool basic_test_64bit(string *vals,double val)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  ostream *poVar9;
  byte *pbVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  runtime_error *this;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  byte *ptr;
  long lVar20;
  byte *pbVar21;
  byte *pbVar22;
  byte bVar23;
  long lVar24;
  int iVar25;
  byte *pbVar26;
  bool bVar27;
  double result_value;
  
  poVar9 = std::operator<<((ostream *)&std::cout," parsing ");
  poVar9 = std::operator<<(poVar9,(string *)vals);
  std::endl<char,std::char_traits<char>>(poVar9);
  ptr = (byte *)(vals->_M_dataplus)._M_p;
  bVar1 = *ptr;
  pbVar10 = ptr;
  bVar14 = bVar1;
  if (bVar1 == 0x2d) {
    bVar14 = ptr[1];
    if ((byte)(bVar14 - 0x30) < 10) {
      pbVar10 = ptr + 1;
      goto LAB_00105e22;
    }
LAB_00105feb:
    pcVar19 = " I could not parse ";
  }
  else {
LAB_00105e22:
    if (bVar14 != 0x30) {
      if ((byte)(bVar14 - 0x30) < 10) {
        uVar18 = (ulong)(byte)(bVar14 - 0x30);
        pbVar21 = pbVar10;
        while( true ) {
          pbVar21 = pbVar21 + 1;
          bVar23 = *pbVar21;
          if (9 < (byte)(bVar23 - 0x30)) break;
          uVar18 = (ulong)(byte)(bVar23 - 0x30) + uVar18 * 10;
        }
        goto LAB_00105e43;
      }
      goto LAB_00105feb;
    }
    bVar23 = pbVar10[1];
    if ((byte)(bVar23 - 0x30) < 10) goto LAB_00105feb;
    pbVar21 = pbVar10 + 1;
    uVar18 = 0;
LAB_00105e43:
    if (bVar23 == 0x2e) {
      bVar15 = pbVar21[1] - 0x30;
      if (9 < bVar15) goto LAB_00105feb;
      pbVar26 = pbVar21 + 1;
      lVar24 = 0;
      pbVar21 = pbVar26;
      do {
        uVar18 = (ulong)bVar15 + uVar18 * 10;
        bVar23 = pbVar21[1];
        pbVar21 = pbVar21 + 1;
        bVar15 = bVar23 - 0x30;
        lVar24 = lVar24 + -1;
      } while (bVar15 < 10);
      iVar25 = (int)pbVar26 - (int)lVar24;
    }
    else {
      lVar24 = 0;
      iVar25 = (int)pbVar21;
    }
    if ((bVar23 | 0x20) == 0x65) {
      pbVar26 = pbVar21 + 1;
      bVar27 = (*pbVar26 - 0x2b & 0xfd) == 0;
      pbVar22 = pbVar21 + 1;
      if (bVar27) {
        pbVar22 = pbVar21 + 2;
      }
      bVar23 = pbVar21[(ulong)bVar27 + 1] - 0x30;
      if (9 < bVar23) goto LAB_00105feb;
      bVar15 = pbVar22[1] - 0x30;
      uVar13 = (ulong)bVar23 * 10 + (ulong)bVar15;
      if (9 < bVar15) {
        uVar13 = (ulong)bVar23;
      }
      pbVar21 = pbVar22 + 2;
      if (9 < bVar15) {
        pbVar21 = pbVar22 + 1;
      }
      bVar23 = pbVar22[(ulong)(bVar15 < 10) + 1] - 0x30;
      pbVar21 = pbVar21 + (bVar23 < 10);
      uVar12 = (ulong)bVar23 + uVar13 * 10;
      if (9 < bVar23) {
        uVar12 = uVar13;
      }
      for (; (byte)(*pbVar21 - 0x30) < 10; pbVar21 = pbVar21 + 1) {
        if ((long)uVar12 < 0x100000000) {
          uVar12 = (ulong)(byte)(*pbVar21 - 0x30) + uVar12 * 10;
        }
      }
      uVar13 = -uVar12;
      if (*pbVar26 != 0x2d) {
        uVar13 = uVar12;
      }
      lVar24 = lVar24 + uVar13;
    }
    if ((int)(~(uint)pbVar10 + iVar25) < 0x13) {
LAB_00105fbc:
      if (lVar24 - 0x135U < 0xfffffffffffffd86) goto LAB_00105fcc;
      if ((uVar18 >> 0x35 == 0) && (lVar24 + 0x16U < 0x2d)) {
        if (lVar24 < 0) {
          result_value = (double)(long)uVar18 /
                         *(double *)
                          (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                           power_of_ten + lVar24 * -8);
        }
        else {
          result_value = (double)(long)uVar18 *
                         *(double *)
                          (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                           power_of_ten + lVar24 * 8);
        }
        if (bVar1 == 0x2d) {
          result_value = -result_value;
        }
      }
      else {
        if (uVar18 != 0) {
          uVar13 = 0x3f;
          if (uVar18 != 0) {
            for (; uVar18 >> uVar13 == 0; uVar13 = uVar13 - 1) {
            }
          }
          uVar18 = uVar18 << ((byte)(uVar13 ^ 0x3f) & 0x3f);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = uVar18;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(fast_double_parser::
                                    compute_float_64(long,unsigned_long,bool,bool*)::mantissa_64 +
                                   lVar24 * 8 + 0xa28);
          auVar2 = auVar2 * auVar4;
          uVar11 = auVar2._0_8_;
          uVar12 = auVar2._8_8_ & 0x1ff;
          if ((uVar12 == 0x1ff) && (uVar12 = 0x1ff, CARRY8(uVar11,uVar18))) {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar18;
            auVar5._8_8_ = 0;
            auVar5._0_8_ = *(ulong *)(fast_double_parser::
                                      compute_float_64(long,unsigned_long,bool,bool*)::mantissa_128
                                     + lVar24 * 8 + 0xa28);
            uVar17 = SUB168(auVar3 * auVar5,8);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar17;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar17;
            auVar7 = auVar2 + auVar7;
            auVar6 = auVar2 + auVar6;
            uVar16 = auVar2._8_4_ + (uint)CARRY8(uVar11,uVar17) & 0x1ff;
            uVar12 = (ulong)uVar16;
            auVar2 = auVar7;
            if ((!CARRY8(SUB168(auVar3 * auVar5,0),uVar18)) ||
               ((uVar11 + uVar17 != -1 || (auVar2 = auVar6, uVar16 != 0x1ff)))) goto LAB_0010609c;
          }
          else {
LAB_0010609c:
            uVar18 = auVar2._8_8_ >> (9U - (auVar2[0xf] >> 7) & 0x3f);
            uVar16 = (uint)uVar18;
            if ((auVar2._0_8_ != 0) || ((uVar12 != 0 || ((uVar16 & 3) != 1)))) {
              uVar18 = (uVar16 & 1) + uVar18;
              uVar12 = uVar18 >> 0x36;
              uVar13 = ((lVar24 * 0x3526a >> 0x10) + 0x43f) -
                       ((auVar2._8_8_ >> 0x3f ^ 1) + (uVar13 ^ 0x3f) + -1 + (ulong)(uVar12 == 0));
              if ((uVar13 != 0) && (uVar13 < 0x7ff)) {
                uVar11 = 0;
                if (uVar12 == 0) {
                  uVar11 = uVar18 >> 1 & 0xefffffffffffff;
                }
                result_value = (double)((ulong)(bVar1 == 0x2d) << 0x3f | uVar11 | uVar13 << 0x34);
                goto LAB_0010617b;
              }
            }
          }
          result_value = 0.0;
          goto LAB_00105fcc;
        }
        if (bVar1 == 0x2d) {
          result_value = -0.0;
        }
        else {
          result_value = 0.0;
        }
      }
    }
    else {
      lVar20 = 1;
      while ((bVar14 == 0x30 || (bVar14 == 0x2e))) {
        pbVar26 = pbVar10 + lVar20;
        lVar20 = lVar20 + 1;
        bVar14 = *pbVar26;
      }
      if ((int)((iVar25 - (uint)pbVar10) - (int)lVar20) < 0x13) goto LAB_00105fbc;
LAB_00105fcc:
      pbVar21 = (byte *)fast_double_parser::parse_float_strtod((char *)ptr,&result_value);
      if (pbVar21 == (byte *)0x0) goto LAB_00105feb;
      ptr = (byte *)(vals->_M_dataplus)._M_p;
    }
LAB_0010617b:
    dVar8 = result_value;
    if (pbVar21 != ptr + vals->_M_string_length) {
      poVar9 = std::operator<<((ostream *)&std::cout,"gap is ");
      poVar9 = std::ostream::_M_insert<long>((long)poVar9);
      std::endl<char,std::char_traits<char>>(poVar9);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"does not point at the end.");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (NAN(val)) {
      if (NAN(result_value)) {
LAB_00106343:
        *(uint *)(std::__cxx11::string::resize + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::resize + *(long *)(std::cout + -0x18)) | 0x104;
        poVar9 = std::ostream::_M_insert<double>(result_value);
        std::operator<<(poVar9," == ");
        poVar9 = std::ostream::_M_insert<double>(val);
        std::endl<char,std::char_traits<char>>(poVar9);
        *(uint *)(std::__cxx11::string::resize + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::resize + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2
        ;
        return true;
      }
      std::operator<<((ostream *)&std::cerr,"not nan");
      poVar9 = std::ostream::_M_insert<double>(dVar8);
      goto LAB_00106009;
    }
    if ((result_value == val) && (!NAN(result_value) && !NAN(val))) goto LAB_00106343;
    poVar9 = std::operator<<((ostream *)&std::cerr,"I got ");
    *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
         *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) | 0x104;
    poVar9 = std::ostream::_M_insert<double>(dVar8);
    std::operator<<(poVar9," but I was expecting ");
    poVar9 = std::ostream::_M_insert<double>(val);
    std::endl<char,std::char_traits<char>>(poVar9);
    *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) =
         *(uint *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) & 0xffffffb5 | 2;
    pcVar19 = "string: ";
  }
  poVar9 = std::operator<<((ostream *)&std::cerr,pcVar19);
  poVar9 = std::operator<<(poVar9,(string *)vals);
LAB_00106009:
  std::endl<char,std::char_traits<char>>(poVar9);
  return false;
}

Assistant:

bool basic_test_64bit(std::string vals, double val) {
  std::cout << " parsing "  << vals << std::endl;
  double result_value;
  const char * ok = fast_double_parser::parse_number(vals.c_str(), & result_value);
  if (!ok) {
    std::cerr << " I could not parse " << vals << std::endl;
    return false;
  }
  if(ok != vals.c_str() + vals.size()) {
    std::cout << "gap is " << (ok - vals.c_str()) << std::endl;
    throw std::runtime_error("does not point at the end.");

  }   
  if (std::isnan(val)) {
    if (!std::isnan(result_value)) {
      std::cerr << "not nan" << result_value << std::endl;
      return false;
    }
  } else if (result_value != val) {
    std::cerr << "I got " << std::hexfloat << result_value << " but I was expecting " << val
              << std::endl;
    std::cerr << std::dec;
    std::cerr << "string: " << vals << std::endl;
    return false;
  }
  std::cout << std::hexfloat << result_value << " == " << val << std::endl;
  std::cout << std::dec;

  return true;
}